

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export.cc
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* anon_unknown.dwarf_1785d::getIDLBase
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Type *type,IDLExport *exporter,string *field_name)

{
  ulong uVar1;
  string local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  string local_130;
  undefined4 local_10c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  string local_e8;
  undefined1 local_b8 [8];
  IDLTypeIdentifierVisitor visitor;
  string type_name;
  string *field_name_local;
  IDLExport *exporter_local;
  Type *type_local;
  
  std::__cxx11::string::string((string *)(visitor.m_namespace.field_2._M_local_buf + 8));
  IDLTypeIdentifierVisitor::IDLTypeIdentifierVisitor((IDLTypeIdentifierVisitor *)local_b8,exporter);
  IDLTypeIdentifierVisitor::apply((IDLTypeIdentifierVisitor *)local_b8,type);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    (anonymous_namespace)::IDLTypeIdentifierVisitor::getTargetNamespace_abi_cxx11_
              (&local_130,local_b8);
    std::operator+(&local_190,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &visitor.m_exporter," ");
    stripLeadingUnderscore(&local_1b0,field_name);
    std::operator+(&local_170,&local_190,&local_1b0);
    std::operator+(&local_150,&local_170,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&visitor.m_front.field_2 + 8));
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_130,&local_150);
    std::__cxx11::string::~string((string *)&local_150);
    std::__cxx11::string::~string((string *)&local_170);
    std::__cxx11::string::~string((string *)&local_1b0);
    std::__cxx11::string::~string((string *)&local_190);
    std::__cxx11::string::~string((string *)&local_130);
  }
  else {
    (anonymous_namespace)::IDLTypeIdentifierVisitor::getTargetNamespace_abi_cxx11_
              (&local_e8,local_b8);
    std::operator+(&local_108,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &visitor.m_exporter,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&visitor.m_front.field_2 + 8));
    std::make_pair<std::__cxx11::string,std::__cxx11::string>
              (__return_storage_ptr__,&local_e8,&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_e8);
  }
  local_10c = 1;
  IDLTypeIdentifierVisitor::~IDLTypeIdentifierVisitor((IDLTypeIdentifierVisitor *)local_b8);
  std::__cxx11::string::~string((string *)(visitor.m_namespace.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

static pair<string, string> getIDLBase(Type const& type, IDLExport const& exporter,
                                           std::string const& field_name = std::string())
    {
        std::string type_name;
        IDLTypeIdentifierVisitor visitor(exporter);

        visitor.apply(type);
        if (field_name.empty()) {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + visitor.m_back);
        } else {
            return make_pair(visitor.getTargetNamespace(),
                             visitor.m_front + " " + stripLeadingUnderscore(field_name) +
                             visitor.m_back);
        }
    }